

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void StoreTrivialContextMap
               (size_t num_types,size_t context_bits,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ushort uVar4;
  long lVar5;
  ulong histogram_length;
  ulong uVar6;
  size_t sVar7;
  undefined8 local_7b0;
  uint8_t depths [272];
  uint16_t bits [272];
  uint32_t histogram [272];
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    lVar1 = context_bits - 1;
    histogram_length = (num_types + context_bits) - 1;
    memset(histogram,0,histogram_length * 4);
    uVar6 = *storage_ix;
    *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3] | 1L << ((byte)uVar6 & 7);
    uVar2 = uVar6 + 1;
    *storage_ix = uVar2;
    *(size_t *)(storage + (uVar2 >> 3)) =
         context_bits - 2 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
    *storage_ix = uVar6 + 5;
    histogram[context_bits - 1] = (uint32_t)num_types;
    histogram[0] = 1;
    for (sVar7 = context_bits; sVar7 < histogram_length; sVar7 = sVar7 + 1) {
      histogram[sVar7] = 1;
    }
    local_7b0 = context_bits;
    BuildAndStoreHuffmanTree
              (histogram,histogram_length,histogram_length,tree,depths,bits,storage_ix,storage);
    bVar3 = depths[local_7b0 - 1];
    uVar4 = bits[local_7b0 - 1];
    for (sVar7 = 0; num_types != sVar7; sVar7 = sVar7 + 1) {
      lVar5 = lVar1 + sVar7;
      if (sVar7 == 0) {
        lVar5 = 0;
      }
      uVar2 = *storage_ix;
      uVar6 = depths[lVar5] + uVar2;
      *(ulong *)(storage + (uVar2 >> 3)) =
           (ulong)bits[lVar5] << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
      *storage_ix = uVar6;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)uVar4 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      uVar6 = uVar6 + bVar3;
      *storage_ix = uVar6;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)(uint)~(-1 << ((byte)lVar1 & 0x1f)) << ((byte)uVar6 & 7) |
           (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar6 + lVar1;
    }
    uVar2 = *storage_ix;
    *(ulong *)(storage + (uVar2 >> 3)) = (ulong)storage[uVar2 >> 3] | 1L << ((byte)uVar2 & 7);
    *storage_ix = uVar2 + 1;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, alphabet_size,
                             tree, depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}